

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransform2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_t sVar1;
  _func_int **pp_Var2;
  long *plVar3;
  TransformNode *in_RDX;
  Node *in_RDI;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> group;
  AffineSpace3fa space1;
  AffineSpace3fa space0;
  Ref<embree::XML> *in_stack_00000760;
  XMLLoader *in_stack_00000768;
  Ref<embree::XML> *in_stack_00001698;
  XMLLoader *in_stack_000016a0;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffda0;
  GroupNode *in_stack_fffffffffffffda8;
  size_t in_stack_fffffffffffffdb8;
  GroupNode *in_stack_fffffffffffffdc0;
  long *local_198;
  ulong local_190;
  long *local_170;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffff40;
  TransformNode *child;
  AffineSpace3fa *in_stack_ffffffffffffff48;
  TransformNode *xfm0;
  TransformNode *this_00;
  
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             &(*(Node **)&(in_RDX->super_Node).super_RefCount._vptr_RefCount)[1].fileName.
              _M_string_length,0);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_00000768,in_stack_00000760);
  this_00 = in_RDX;
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             &(*(Node **)&(in_RDX->super_Node).super_RefCount._vptr_RefCount)[1].fileName.
              _M_string_length,1);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_00000768,in_stack_00000760);
  xfm0 = in_RDX;
  sVar1 = XML::size((XML *)0x3b7689);
  if (sVar1 == 3) {
    pp_Var2 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3b769d);
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               &(*(Node **)&(in_RDX->super_Node).super_RefCount._vptr_RefCount)[1].fileName.
                _M_string_length,2);
    loadNode(in_stack_000016a0,in_stack_00001698);
    SceneGraph::TransformNode::TransformNode
              (this_00,(AffineSpace3fa *)xfm0,(AffineSpace3fa *)in_RDX,in_stack_ffffffffffffff40);
    (in_RDI->super_RefCount)._vptr_RefCount = pp_Var2;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    if (local_170 != (long *)0x0) {
      (**(code **)(*local_170 + 0x18))();
    }
  }
  else {
    plVar3 = (long *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))();
    }
    for (local_190 = 2; child = in_RDX, sVar1 = XML::size((XML *)0x3b7911), local_190 < sVar1;
        local_190 = local_190 + 1) {
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 &(*(Node **)&(in_RDX->super_Node).super_RefCount._vptr_RefCount)[1].fileName.
                  _M_string_length,local_190);
      loadNode(in_stack_000016a0,in_stack_00001698);
      SceneGraph::GroupNode::add(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      if (local_198 != (long *)0x0) {
        (**(code **)(*local_198 + 0x18))();
      }
    }
    pp_Var2 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3b7aa9);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))();
    }
    SceneGraph::TransformNode::TransformNode
              (this_00,(AffineSpace3fa *)xfm0,in_stack_ffffffffffffff48,
               (Ref<embree::SceneGraph::Node> *)child);
    (in_RDI->super_RefCount)._vptr_RefCount = pp_Var2;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x18))();
      (**(code **)(*plVar3 + 0x18))();
    }
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransform2Node(const Ref<XML>& xml) 
  {
    AffineSpace3fa space0 = load<AffineSpace3fa>(xml->children[0]);
    AffineSpace3fa space1 = load<AffineSpace3fa>(xml->children[1]);

    if (xml->size() == 3)
      return new SceneGraph::TransformNode(space0,space1,loadNode(xml->children[2]));
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=2; i<xml->size(); i++) 
      group->add(loadNode(xml->children[i]));

    return new SceneGraph::TransformNode(space0,space1,group.cast<SceneGraph::Node>());
  }